

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall
QListModel::ensureSorted(QListModel *this,int column,SortOrder order,int start,int end)

{
  QListWidgetItem **ppQVar1;
  QListWidgetItem **ppQVar2;
  char cVar3;
  ulong uVar4;
  QListWidgetItem **ppQVar5;
  long lVar6;
  long lVar7;
  code *pcVar8;
  
  if (column == 0) {
    uVar4 = 1;
    if (1 < start) {
      uVar4 = (ulong)(uint)start;
    }
    ppQVar2 = (this->items).d.ptr;
    lVar7 = (this->items).d.size;
    lVar6 = (long)(end + 2);
    if (lVar7 < end + 2) {
      lVar6 = lVar7;
    }
    ppQVar1 = ppQVar2 + lVar6;
    pcVar8 = ensureSorted::anon_class_1_0_00000001::__invoke;
    if (order == AscendingOrder) {
      pcVar8 = ensureSorted::anon_class_1_0_00000001::__invoke;
    }
    ppQVar5 = ppQVar1;
    if (ppQVar2 + (uVar4 - 1) != ppQVar1) {
      lVar7 = lVar6 * 8 + uVar4 * -8;
      ppQVar2 = ppQVar2 + uVar4;
      do {
        ppQVar5 = ppQVar2;
        if (lVar7 == 0) break;
        cVar3 = (*pcVar8)(*ppQVar5,ppQVar5[-1]);
        lVar7 = lVar7 + -8;
        ppQVar2 = ppQVar5 + 1;
      } while (cVar3 == '\0');
    }
    if (ppQVar5 != ppQVar1) {
      (**(code **)(*(long *)this + 0x140))(this,0,order);
      return;
    }
  }
  return;
}

Assistant:

void QListModel::ensureSorted(int column, Qt::SortOrder order, int start, int end)
{
    if (column != 0)
        return;

    const auto compareLt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *left < *right;
    };

    const auto compareGt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *right < *left;
    };

    /** Check if range [start,end] is already in sorted position in list.
     *  Take for this the assumption, that outside [start,end] the list
     *  is already sorted. Therefore the sorted check has to be extended
     *  to the first element that is known to be sorted before the range
     *  [start, end], which is (start-1) and the first element after the
     *  range [start, end], which is (end+2) due to end being included.
    */
    const auto beginChangedIterator = items.constBegin() + qMax(start - 1, 0);
    const auto endChangedIterator = items.constBegin() + qMin(end + 2, items.size());
    const bool needsSorting = !std::is_sorted(beginChangedIterator, endChangedIterator,
                                              order == Qt::AscendingOrder ? compareLt : compareGt);

    if (needsSorting)
        sort(column, order);
}